

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O2

Data * Integer::divide(vector<Data_*,_std::allocator<Data_*>_> *dataPara)

{
  Integer *this;
  
  this = (Integer *)operator_new(0x18);
  Integer(this,(long *)(*(dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1));
  this->value = this->value /
                (long)(dataPara->super__Vector_base<Data_*,_std::allocator<Data_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[1][1]._vptr_Data;
  return &this->super_Data;
}

Assistant:

Data *Integer::divide(std::vector<Data *> *dataPara) {
    auto result = new Integer(((Integer *) ((*dataPara)[0]))->value);
    result->value /= ((Integer *) ((*dataPara)[1]))->value;
    return result;
}